

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

char * __thiscall
btQuantizedBvh::serialize(btQuantizedBvh *this,void *dataBuffer,btSerializer *serializer)

{
  float fVar1;
  int iVar2;
  long lVar3;
  btOptimizedBvhNode *pbVar4;
  btQuantizedBvhNode *pbVar5;
  btBvhSubtreeInfo *pbVar6;
  long *in_RDX;
  btVector3FloatData *in_RSI;
  long in_RDI;
  int i_2;
  btBvhSubtreeInfoData *memPtr_2;
  btChunk *chunk_2;
  int numElem_2;
  int sz_2;
  int i_1;
  btQuantizedBvhNodeData *memPtr_1;
  btChunk *chunk_1;
  int numElem_1;
  int sz_1;
  int i;
  btOptimizedBvhNodeFloatData *memPtr;
  btChunk *chunk;
  int numElem;
  int sz;
  btQuantizedBvhFloatData *quantizedData;
  undefined8 local_d0;
  undefined8 local_b0;
  undefined8 local_90;
  int local_7c;
  int *local_78;
  int local_5c;
  unsigned_short *local_58;
  int local_3c;
  btVector3FloatData *local_38;
  
  btVector3::serialize((btVector3 *)(in_RDI + 0x18),in_RSI + 1);
  btVector3::serialize((btVector3 *)(in_RDI + 8),in_RSI);
  btVector3::serialize((btVector3 *)(in_RDI + 0x28),in_RSI + 2);
  in_RSI[3].m_floats[0] = *(float *)(in_RDI + 0x3c);
  in_RSI[3].m_floats[1] = (float)(uint)(*(byte *)(in_RDI + 0x40) & 1);
  fVar1 = (float)btAlignedObjectArray<btOptimizedBvhNode>::size
                           ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68));
  in_RSI[3].m_floats[2] = fVar1;
  iVar2 = btAlignedObjectArray<btOptimizedBvhNode>::size
                    ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68));
  if (iVar2 == 0) {
    local_90 = 0;
  }
  else {
    btAlignedObjectArray<btOptimizedBvhNode>::operator[]
              ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),0);
    local_90 = (**(code **)(*in_RDX + 0x38))();
  }
  *(undefined8 *)in_RSI[4].m_floats = local_90;
  if (*(long *)in_RSI[4].m_floats != 0) {
    iVar2 = btAlignedObjectArray<btOptimizedBvhNode>::size
                      ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68));
    lVar3 = (**(code **)(*in_RDX + 0x20))(in_RDX,0x30,iVar2);
    local_38 = *(btVector3FloatData **)(lVar3 + 8);
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      pbVar4 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_3c);
      btVector3::serialize(&pbVar4->m_aabbMaxOrg,local_38 + 1);
      pbVar4 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_3c);
      btVector3::serialize(&pbVar4->m_aabbMinOrg,local_38);
      pbVar4 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_3c);
      local_38[2].m_floats[0] = (float)pbVar4->m_escapeIndex;
      pbVar4 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_3c);
      local_38[2].m_floats[1] = (float)pbVar4->m_subPart;
      pbVar4 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_3c);
      local_38[2].m_floats[2] = (float)pbVar4->m_triangleIndex;
      local_38 = local_38 + 3;
    }
    pbVar4 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),0);
    (**(code **)(*in_RDX + 0x28))(in_RDX,lVar3,"btOptimizedBvhNodeData",0x59415241,pbVar4);
  }
  fVar1 = (float)btAlignedObjectArray<btQuantizedBvhNode>::size
                           ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8));
  in_RSI[3].m_floats[3] = fVar1;
  iVar2 = btAlignedObjectArray<btQuantizedBvhNode>::size
                    ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8));
  if (iVar2 == 0) {
    local_b0 = 0;
  }
  else {
    btAlignedObjectArray<btQuantizedBvhNode>::operator[]
              ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),0);
    local_b0 = (**(code **)(*in_RDX + 0x38))();
  }
  *(undefined8 *)(in_RSI[4].m_floats + 2) = local_b0;
  if (*(long *)(in_RSI[4].m_floats + 2) != 0) {
    iVar2 = btAlignedObjectArray<btQuantizedBvhNode>::size
                      ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8));
    lVar3 = (**(code **)(*in_RDX + 0x20))(in_RDX,0x10,iVar2);
    local_58 = *(unsigned_short **)(lVar3 + 8);
    for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      *(int *)(local_58 + 6) = pbVar5->m_escapeIndexOrTriangleIndex;
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      local_58[3] = pbVar5->m_quantizedAabbMax[0];
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      local_58[4] = pbVar5->m_quantizedAabbMax[1];
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      local_58[5] = pbVar5->m_quantizedAabbMax[2];
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      *local_58 = pbVar5->m_quantizedAabbMin[0];
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      local_58[1] = pbVar5->m_quantizedAabbMin[1];
      pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_5c);
      local_58[2] = pbVar5->m_quantizedAabbMin[2];
      local_58 = local_58 + 8;
    }
    pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),0);
    (**(code **)(*in_RDX + 0x28))(in_RDX,lVar3,"btQuantizedBvhNodeData",0x59415241,pbVar5);
  }
  in_RSI[5].m_floats[2] = *(float *)(in_RDI + 200);
  fVar1 = (float)btAlignedObjectArray<btBvhSubtreeInfo>::size
                           ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0));
  in_RSI[5].m_floats[3] = fVar1;
  iVar2 = btAlignedObjectArray<btBvhSubtreeInfo>::size
                    ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0));
  if (iVar2 == 0) {
    local_d0 = 0;
  }
  else {
    pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                       ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),0);
    local_d0 = (**(code **)(*in_RDX + 0x38))(in_RDX,pbVar6);
  }
  *(undefined8 *)in_RSI[5].m_floats = local_d0;
  if (*(long *)in_RSI[5].m_floats != 0) {
    iVar2 = btAlignedObjectArray<btBvhSubtreeInfo>::size
                      ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0));
    lVar3 = (**(code **)(*in_RDX + 0x20))(in_RDX,0x14,iVar2);
    local_78 = *(int **)(lVar3 + 8);
    for (local_7c = 0; local_7c < iVar2; local_7c = local_7c + 1) {
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *(unsigned_short *)((long)local_78 + 0xe) = pbVar6->m_quantizedAabbMax[0];
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *(unsigned_short *)(local_78 + 4) = pbVar6->m_quantizedAabbMax[1];
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *(unsigned_short *)((long)local_78 + 0x12) = pbVar6->m_quantizedAabbMax[2];
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *(unsigned_short *)(local_78 + 2) = pbVar6->m_quantizedAabbMin[0];
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *(unsigned_short *)((long)local_78 + 10) = pbVar6->m_quantizedAabbMin[1];
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *(unsigned_short *)(local_78 + 3) = pbVar6->m_quantizedAabbMin[2];
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      *local_78 = pbVar6->m_rootNodeIndex;
      pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_7c);
      local_78[1] = pbVar6->m_subtreeSize;
      local_78 = local_78 + 5;
    }
    pbVar6 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                       ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),0);
    (**(code **)(*in_RDX + 0x28))(in_RDX,lVar3,"btBvhSubtreeInfoData",0x59415241,pbVar6);
  }
  return "btQuantizedBvhFloatData";
}

Assistant:

const char*	btQuantizedBvh::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btQuantizedBvhData* quantizedData = (btQuantizedBvhData*)dataBuffer;
	
	m_bvhAabbMax.serialize(quantizedData->m_bvhAabbMax);
	m_bvhAabbMin.serialize(quantizedData->m_bvhAabbMin);
	m_bvhQuantization.serialize(quantizedData->m_bvhQuantization);

	quantizedData->m_curNodeIndex = m_curNodeIndex;
	quantizedData->m_useQuantization = m_useQuantization;
	
	quantizedData->m_numContiguousLeafNodes = m_contiguousNodes.size();
	quantizedData->m_contiguousNodesPtr = (btOptimizedBvhNodeData*) (m_contiguousNodes.size() ? serializer->getUniquePointer((void*)&m_contiguousNodes[0]) : 0);
	if (quantizedData->m_contiguousNodesPtr)
	{
		int sz = sizeof(btOptimizedBvhNodeData);
		int numElem = m_contiguousNodes.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btOptimizedBvhNodeData* memPtr = (btOptimizedBvhNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_contiguousNodes[i].m_aabbMaxOrg.serialize(memPtr->m_aabbMaxOrg);
			m_contiguousNodes[i].m_aabbMinOrg.serialize(memPtr->m_aabbMinOrg);
			memPtr->m_escapeIndex = m_contiguousNodes[i].m_escapeIndex;
			memPtr->m_subPart = m_contiguousNodes[i].m_subPart;
			memPtr->m_triangleIndex = m_contiguousNodes[i].m_triangleIndex;
		}
		serializer->finalizeChunk(chunk,"btOptimizedBvhNodeData",BT_ARRAY_CODE,(void*)&m_contiguousNodes[0]);
	}

	quantizedData->m_numQuantizedContiguousNodes = m_quantizedContiguousNodes.size();
//	printf("quantizedData->m_numQuantizedContiguousNodes=%d\n",quantizedData->m_numQuantizedContiguousNodes);
	quantizedData->m_quantizedContiguousNodesPtr =(btQuantizedBvhNodeData*) (m_quantizedContiguousNodes.size() ? serializer->getUniquePointer((void*)&m_quantizedContiguousNodes[0]) : 0);
	if (quantizedData->m_quantizedContiguousNodesPtr)
	{
		int sz = sizeof(btQuantizedBvhNodeData);
		int numElem = m_quantizedContiguousNodes.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btQuantizedBvhNodeData* memPtr = (btQuantizedBvhNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex;
			memPtr->m_quantizedAabbMax[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[2];
		}
		serializer->finalizeChunk(chunk,"btQuantizedBvhNodeData",BT_ARRAY_CODE,(void*)&m_quantizedContiguousNodes[0]);
	}

	quantizedData->m_traversalMode = int(m_traversalMode);
	quantizedData->m_numSubtreeHeaders = m_SubtreeHeaders.size();

	quantizedData->m_subTreeInfoPtr = (btBvhSubtreeInfoData*) (m_SubtreeHeaders.size() ? serializer->getUniquePointer((void*)&m_SubtreeHeaders[0]) : 0);
	if (quantizedData->m_subTreeInfoPtr)
	{
		int sz = sizeof(btBvhSubtreeInfoData);
		int numElem = m_SubtreeHeaders.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btBvhSubtreeInfoData* memPtr = (btBvhSubtreeInfoData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_quantizedAabbMax[0] = m_SubtreeHeaders[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_SubtreeHeaders[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_SubtreeHeaders[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_SubtreeHeaders[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_SubtreeHeaders[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_SubtreeHeaders[i].m_quantizedAabbMin[2];

			memPtr->m_rootNodeIndex = m_SubtreeHeaders[i].m_rootNodeIndex;
			memPtr->m_subtreeSize = m_SubtreeHeaders[i].m_subtreeSize;
		}
		serializer->finalizeChunk(chunk,"btBvhSubtreeInfoData",BT_ARRAY_CODE,(void*)&m_SubtreeHeaders[0]);
	}
	return btQuantizedBvhDataName;
}